

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_operators.cpp
# Opt level: O3

void __thiscall
test_vector_operators_cross_product_Test::~test_vector_operators_cross_product_Test
          (test_vector_operators_cross_product_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_vector_operators, cross_product) {
  Vector_Dense<Scalar, 0> dynamic_vector_0 = {1.0, 0.0, 0.0};
  Vector_Dense<Scalar, 0> dynamic_vector_1 = {0.0, 0.0, 1.0};
  Vector_Dense<Scalar, 3> static_vector_0 = {0.0, 1.0, 0.0};
  Vector_Dense<Scalar, 3> static_vector_1 = {0.0, 0.0, 1.0};

  Vector_Dense<Scalar, 0> dynamic_result = cross_product(dynamic_vector_0, dynamic_vector_1);
  Vector_Dense<Scalar, 3> static_result = cross_product(static_vector_0, static_vector_1);
  EXPECT_DOUBLE_EQ(dynamic_result[0], 0.0);
  EXPECT_DOUBLE_EQ(dynamic_result[1], -1.0);
  EXPECT_DOUBLE_EQ(dynamic_result[2], 0.0);
  EXPECT_DOUBLE_EQ(static_result[0], 1.0);
  EXPECT_DOUBLE_EQ(static_result[1], 0.0);
  EXPECT_DOUBLE_EQ(static_result[2], 0.0);

  dynamic_result = cross_product(dynamic_vector_1, dynamic_vector_0);
  static_result = cross_product(static_vector_1, static_vector_0);
  EXPECT_DOUBLE_EQ(dynamic_result[0], 0.0);
  EXPECT_DOUBLE_EQ(dynamic_result[1], 1.0);
  EXPECT_DOUBLE_EQ(dynamic_result[2], 0.0);
  EXPECT_DOUBLE_EQ(static_result[0], -1.0);
  EXPECT_DOUBLE_EQ(static_result[1], 0.0);
  EXPECT_DOUBLE_EQ(static_result[2], 0.0);

  static_result = cross_product(dynamic_vector_0, static_vector_0);
  EXPECT_DOUBLE_EQ(static_result[0], 0.0);
  EXPECT_DOUBLE_EQ(static_result[1], 0.0);
  EXPECT_DOUBLE_EQ(static_result[2], 1.0);

  Vector_Dense<Scalar, 0> dynamics_bad_size = {1.0, 2.0};
  EXPECT_DEATH(cross_product(dynamic_vector_0, dynamics_bad_size), "./*");
  EXPECT_DEATH(cross_product(static_vector_0, dynamics_bad_size), "./*");
  EXPECT_DEATH(cross_product(Vector_Dense<Scalar, 4>(), Vector_Dense<Scalar, 4>()), "./*");
}